

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetReturnNewest(void *kinmem,int ret_newest)

{
  undefined4 in_ESI;
  long in_RDI;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == 0) {
    KINProcessError((KINMem)0x0,-1,0x126,"KINSetReturnNewest",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x160) = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINSetReturnNewest(void* kinmem, sunbooleantype ret_newest)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  kin_mem->kin_ret_newest = ret_newest;

  return (KIN_SUCCESS);
}